

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O0

void do_recall(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ROOM_INDEX_DATA *argument_00;
  CHAR_DATA *in_RSI;
  void *in_RDI;
  __type_conflict2 _Var4;
  int skill;
  char buf [4608];
  CHAR_DATA *victim;
  ROOM_INDEX_DATA *location;
  char *in_stack_00004a00;
  CHAR_DATA *in_stack_00004a08;
  undefined7 in_stack_ffffffffffffeda8;
  undefined1 in_stack_ffffffffffffedaf;
  CHAR_DATA *in_stack_ffffffffffffedb0;
  void *arg1;
  undefined4 in_stack_ffffffffffffedb8;
  int in_stack_ffffffffffffedbc;
  char *in_stack_ffffffffffffedc0;
  CHAR_DATA *ch_00;
  ROOM_INDEX_DATA *in_stack_ffffffffffffedd8;
  CHAR_DATA *in_stack_ffffffffffffede0;
  CHAR_DATA *in_stack_ffffffffffffee00;
  int in_stack_ffffffffffffee84;
  undefined1 in_stack_ffffffffffffee8b;
  int in_stack_ffffffffffffee8c;
  CHAR_DATA *in_stack_ffffffffffffee90;
  int in_stack_ffffffffffffeeac;
  CHAR_DATA *in_stack_ffffffffffffeeb0;
  
  bVar2 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8));
  if ((bVar2) &&
     (uVar1 = *(ulong *)((long)in_RDI + 0x180), _Var4 = std::pow<int,int>(0,0x56893d),
     (uVar1 & (long)_Var4) == 0)) {
    send_to_char(in_stack_ffffffffffffedc0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8));
  }
  else if ((*(short *)((long)in_RDI + 0x138) < 0x10) ||
          ((bVar2 = is_immortal((CHAR_DATA *)
                                CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8)),
           bVar2 || (*(short *)((long)in_RDI + 0x2dc) != 0)))) {
    act(in_stack_ffffffffffffedc0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8),
        in_stack_ffffffffffffedb0,
        (void *)CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),0);
    argument_00 = get_room_index(in_stack_ffffffffffffedbc);
    if (argument_00 == (ROOM_INDEX_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffedc0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8));
    }
    else if (*(ROOM_INDEX_DATA **)((long)in_RDI + 0xa8) != argument_00) {
      ch_00 = *(CHAR_DATA **)(*(long *)((long)in_RDI + 0xa8) + 0x140);
      _Var4 = std::pow<int,int>(0,0x568a70);
      if ((((ulong)ch_00 & (long)_Var4) != 0) ||
         (bVar2 = is_affected_by((CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8),
                                 (int)((ulong)in_stack_ffffffffffffedb0 >> 0x20)), bVar2)) {
        send_to_char((char *)ch_00,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8));
      }
      else {
        if (*(long *)((long)in_RDI + 0x20) != 0) {
          iVar3 = get_skill(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac);
          in_stack_ffffffffffffedbc = number_percent();
          if (in_stack_ffffffffffffedbc < (iVar3 * 0x50) / 100) {
            check_improve(in_stack_ffffffffffffee90,in_stack_ffffffffffffee8c,
                          (bool)in_stack_ffffffffffffee8b,in_stack_ffffffffffffee84);
            WAIT_STATE(ch_00,in_stack_ffffffffffffedbc);
            sprintf(&stack0xffffffffffffedd8,"You failed!\n\r");
            send_to_char((char *)ch_00,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8))
            ;
            return;
          }
          check_improve(in_stack_ffffffffffffee90,in_stack_ffffffffffffee8c,
                        (bool)in_stack_ffffffffffffee8b,in_stack_ffffffffffffee84);
          sprintf(&stack0xffffffffffffedd8,"You recall from combat!\n\r");
          send_to_char((char *)ch_00,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8));
          stop_fighting(in_stack_ffffffffffffedb0,(bool)in_stack_ffffffffffffedaf);
        }
        un_watermeld(in_stack_ffffffffffffedb0,
                     (char *)CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8));
        *(short *)((long)in_RDI + 0x162) = *(short *)((long)in_RDI + 0x162) / 2;
        arg1 = in_RDI;
        act((char *)ch_00,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8)
            ,in_RDI,(void *)CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),0);
        char_from_room(in_stack_ffffffffffffee00);
        char_to_room(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
        act((char *)ch_00,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8)
            ,arg1,(void *)CONCAT17(in_stack_ffffffffffffedaf,in_stack_ffffffffffffeda8),0);
        do_look(in_stack_00004a08,in_stack_00004a00);
        if (*(long *)((long)in_RDI + 0x30) != 0) {
          do_recall(in_RSI,(char *)argument_00);
        }
      }
    }
  }
  else {
    send_to_char(in_stack_ffffffffffffedc0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8));
  }
  return;
}

Assistant:

void do_recall(CHAR_DATA *ch, char *argument)
{
	if (is_npc(ch) && !IS_SET(ch->act, ACT_PET))
	{
		send_to_char("Only players can recall.\n\r", ch);
		return;
	}

	if (ch->level > 15 && !is_immortal(ch) && !ch->ghost)
	{
		send_to_char("Those who have passed the 15th rank cannot recall.\n\r", ch);
		return;
	}

	act("$n prays for transportation!", ch, 0, 0, TO_ROOM);

	auto location = get_room_index(hometown_table[ch->hometown].recall);
	if (location == nullptr)
	{
		send_to_char("Your temple has been destroyed...pray to the Gods for help!\n\r", ch);
		return;
	}

	if (ch->in_room == location)
		return;

	if (IS_SET(ch->in_room->room_flags, ROOM_NO_RECALL) || is_affected_by(ch, AFF_CURSE))
	{
		send_to_char("The gods have forsaken you.\n\r", ch);
		return;
	}

	auto victim = ch->fighting;
	if (victim != nullptr)
	{
		char buf[MAX_STRING_LENGTH];
		auto skill = get_skill(ch, gsn_recall);

		if (number_percent() < 80 * skill / 100)
		{
			check_improve(ch, gsn_recall, false, 6);

			WAIT_STATE(ch, 4);

			sprintf(buf, "You failed!\n\r");
			send_to_char(buf, ch);
			return;
		}

		check_improve(ch, gsn_recall, true, 4);
		sprintf(buf, "You recall from combat!\n\r");
		send_to_char(buf, ch);
		stop_fighting(ch, true);
	}

	un_watermeld(ch, nullptr);

	ch->move /= 2;

	act("$n disappears.", ch, nullptr, nullptr, TO_ROOM);

	char_from_room(ch);
	char_to_room(ch, location);

	act("$n appears in the room.", ch, nullptr, nullptr, TO_ROOM);

	do_look(ch, "auto");

	if (ch->pet != nullptr)
		do_recall(ch->pet, "");
}